

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_half_to_float_3chan_interleave(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int y;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  uint *puVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  
  iVar6 = (decode->chunk).height - decode->user_line_end_ignore;
  iVar8 = decode->user_line_begin_skip;
  if (iVar8 < iVar6) {
    peVar3 = decode->channels;
    uVar1 = peVar3->width;
    pvVar4 = decode->unpacked_buffer;
    lVar12 = (long)(int)(uVar1 * 6);
    lVar17 = (long)(int)(uVar1 * 6 * iVar8);
    lVar13 = (long)pvVar4 + lVar17;
    puVar14 = (uint *)(peVar3->field_12).decode_to_ptr;
    iVar2 = peVar3->user_line_stride;
    lVar9 = lVar17 + (long)(int)uVar1 * 4 + (long)pvVar4;
    lVar17 = lVar17 + (long)(int)uVar1 * 2 + (long)pvVar4;
    do {
      if (0 < (int)uVar1) {
        uVar18 = 0;
        puVar15 = puVar14;
        do {
          uVar10 = (uint)*(short *)(lVar13 + uVar18 * 2);
          uVar16 = (uVar10 & 0x7fff) << 0xd;
          uVar11 = uVar10 & 0x80000000;
          if (uVar16 < 0x800000) {
            if ((uVar10 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar10 & 0x7fff) != 0) {
                for (; uVar16 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar7 = (uVar5 ^ 0x1f) - 8;
              uVar11 = (uVar11 | uVar16 << ((byte)iVar7 & 0x1f) | 0x38800000) + iVar7 * -0x800000;
            }
          }
          else if (uVar16 < 0xf800000) {
            uVar11 = (uVar11 | uVar16) + 0x38000000;
          }
          else {
            uVar11 = uVar11 | uVar16 | 0x7f800000;
          }
          *puVar15 = uVar11;
          uVar10 = (uint)*(short *)(lVar17 + uVar18 * 2);
          uVar16 = (uVar10 & 0x7fff) << 0xd;
          uVar11 = uVar10 & 0x80000000;
          if (uVar16 < 0x800000) {
            if ((uVar10 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar10 & 0x7fff) != 0) {
                for (; uVar16 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar7 = (uVar5 ^ 0x1f) - 8;
              uVar11 = (uVar11 | uVar16 << ((byte)iVar7 & 0x1f) | 0x38800000) + iVar7 * -0x800000;
            }
          }
          else if (uVar16 < 0xf800000) {
            uVar11 = (uVar11 | uVar16) + 0x38000000;
          }
          else {
            uVar11 = uVar11 | uVar16 | 0x7f800000;
          }
          puVar15[1] = uVar11;
          uVar10 = (uint)*(short *)(lVar9 + uVar18 * 2);
          uVar16 = (uVar10 & 0x7fff) << 0xd;
          uVar11 = uVar10 & 0x80000000;
          if (uVar16 < 0x800000) {
            if ((uVar10 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar10 & 0x7fff) != 0) {
                for (; uVar16 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar7 = (uVar5 ^ 0x1f) - 8;
              uVar11 = (uVar11 | uVar16 << ((byte)iVar7 & 0x1f) | 0x38800000) + iVar7 * -0x800000;
            }
          }
          else if (uVar16 < 0xf800000) {
            uVar11 = (uVar11 | uVar16) + 0x38000000;
          }
          else {
            uVar11 = uVar11 | uVar16 | 0x7f800000;
          }
          puVar15[2] = uVar11;
          puVar15 = puVar15 + 3;
          uVar18 = uVar18 + 1;
        } while (uVar1 != uVar18);
      }
      lVar13 = lVar13 + lVar12;
      puVar14 = (uint *)((long)puVar14 + (long)iVar2);
      iVar8 = iVar8 + 1;
      lVar9 = lVar9 + lVar12;
      lVar17 = lVar17 + lVar12;
    } while (iVar8 < iVar6);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in0[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in2[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}